

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O3

void __thiscall libchars::commands::show_help(commands *this)

{
  size_t *psVar1;
  _Rb_tree_header *p_Var2;
  status_t sVar3;
  _List_node_base *p_Var4;
  undefined1 auVar5 [8];
  int iVar6;
  uint uVar7;
  debug *this_00;
  token *ptVar8;
  _Rb_tree_node_base *p_Var9;
  _List_node_base *p_Var10;
  char cVar11;
  char *__s;
  _Self __tmp;
  _Base_ptr p_Var12;
  token *ptVar13;
  _List_node_base *p_Var14;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined1 local_68 [8];
  command_list_t match;
  string cmd_str_search;
  
  puts("?");
  sVar3 = this->status;
  if (sVar3 < TERMINATED) {
    if ((0xf1U >> (sVar3 & 0x1f) & 1) == 0) {
      if ((10U >> (sVar3 & 0x1f) & 1) == 0) {
        __s = "No known commands match current line";
      }
      else {
        if (this->cmd == (command *)0x0) {
          match.super__List_base<libchars::command_*,_std::allocator<libchars::command_*>_>._M_impl.
          _M_node._M_size = (size_t)&cmd_str_search._M_string_length;
          cmd_str_search._M_dataplus._M_p = (pointer)0x0;
          cmd_str_search._M_string_length._0_1_ = 0;
          if (this->t_cmd != (token *)0x0) {
            psVar1 = &match.
                      super__List_base<libchars::command_*,_std::allocator<libchars::command_*>_>.
                      _M_impl._M_node._M_size;
            ptVar13 = this->t_cmd;
            do {
              if (ptVar13->length == 0) break;
              this_00 = debug::initialize(0);
              debug::log(this_00,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
              cVar11 = (char)psVar1;
              if (cmd_str_search._M_dataplus._M_p != (pointer)0x0) {
                std::__cxx11::string::push_back(cVar11);
              }
              std::__cxx11::string::_M_append
                        ((char *)psVar1,(ulong)(ptVar13->value)._M_dataplus._M_p);
              ptVar8 = ptVar13->next;
              if (ptVar8 == (token *)0x0) {
                if ((this->super_edit_object).insert_idx <= ptVar13->length + ptVar13->offset)
                break;
                std::__cxx11::string::push_back(cVar11);
                ptVar8 = ptVar13->next;
              }
              ptVar13 = ptVar8;
            } while (ptVar8 != (token *)0x0);
          }
          local_68 = (undefined1  [8])local_68;
          match.super__List_base<libchars::command_*,_std::allocator<libchars::command_*>_>._M_impl.
          _M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
          p_Var12 = (this->C_sorted)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var2 = &(this->C_sorted)._M_t._M_impl.super__Rb_tree_header;
          match.super__List_base<libchars::command_*,_std::allocator<libchars::command_*>_>._M_impl.
          _M_node.super__List_node_base._M_next = (_List_node_base *)local_68;
          if ((_Rb_tree_header *)p_Var12 != p_Var2) {
            p_Var14 = (_List_node_base *)0x0;
            do {
              p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
              p_Var4 = *(_List_node_base **)(p_Var12 + 1);
              if (((((ulong)p_Var4[8]._M_next & this->mask) != 0) &&
                  (*(char *)&p_Var4[8]._M_prev == '\0')) &&
                 ((cmd_str_search._M_dataplus._M_p == (pointer)0x0 ||
                  (iVar6 = std::__cxx11::string::compare
                                     ((ulong)&p_Var4[2]._M_prev,0,
                                      (string *)cmd_str_search._M_dataplus._M_p), iVar6 == 0)))) {
                p_Var10 = (_List_node_base *)operator_new(0x18);
                p_Var10[1]._M_next = p_Var4;
                std::__detail::_List_node_base::_M_hook(p_Var10);
                match.super__List_base<libchars::command_*,_std::allocator<libchars::command_*>_>.
                _M_impl._M_node.super__List_node_base._M_prev =
                     (_List_node_base *)
                     ((long)&(match.
                              super__List_base<libchars::command_*,_std::allocator<libchars::command_*>_>
                              ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1);
                uVar7 = (uint)p_Var4[3]._M_next;
                if (p_Var4[3]._M_next <= p_Var14) {
                  uVar7 = (uint)p_Var14;
                }
                p_Var14 = (_List_node_base *)(ulong)uVar7;
              }
              p_Var12 = p_Var9;
            } while ((_Rb_tree_header *)p_Var9 != p_Var2);
            auVar5 = local_68;
            while (p_Var4 = (_List_node_base *)local_68, auVar5 != (undefined1  [8])local_68) {
              p_Var4 = ((_List_node_base *)auVar5)->_M_next;
              printf("%-*s : %s\n",p_Var14,
                     ((_List_node_base *)((long)auVar5 + 0x10))->_M_next[2]._M_prev,
                     ((_List_node_base *)((long)auVar5 + 0x10))->_M_next[4]._M_prev);
              auVar5 = (undefined1  [8])p_Var4;
            }
            while (p_Var4 != (_List_node_base *)local_68) {
              p_Var14 = p_Var4->_M_next;
              operator_delete(p_Var4,0x18);
              p_Var4 = p_Var14;
            }
          }
          if ((size_type *)
              match.super__List_base<libchars::command_*,_std::allocator<libchars::command_*>_>.
              _M_impl._M_node._M_size != &cmd_str_search._M_string_length) {
            operator_delete((void *)match.
                                    super__List_base<libchars::command_*,_std::allocator<libchars::command_*>_>
                                    ._M_impl._M_node._M_size,
                            CONCAT71(cmd_str_search._M_string_length._1_7_,
                                     (undefined1)cmd_str_search._M_string_length) + 1);
          }
          goto LAB_0010d804;
        }
        __s = "** INTERNAL ERROR: partial command **";
      }
      puts(__s);
    }
    else {
      show_parameters(this);
    }
  }
LAB_0010d804:
  (this->super_edit_object).cursor = 0;
  (this->super_edit_object).prompt_rendered = 0;
  return;
}

Assistant:

void commands::show_help()
    {
        printf("?\n");

        //TODO: use terminal driver to print strings
        //TODO: pretty-print (e.g. start help in same column)

        switch (status) {
        case TERMINATED:
        case TIMEOUT:
        case FORCED_RETURN:
            // ignore
            break;
        case VALID_COMMAND:
        case MISSING_VALUE:
        case INVALID_ARG:
        case TOO_FEW_ARGS:
        case TOO_MANY_ARGS:
            // command known --> dump parameter help
            show_parameters();
            break;
        case NO_COMMAND:
            // invalid command --> cannot show help
            printf("No known commands match current line\n");
            break;
        case EMPTY:
        case PARTIAL_COMMAND:
            // empty / partially known --> find list of commands that match partial string
            if (cmd != NULL) {
                printf("** INTERNAL ERROR: partial command **\n");
            }
            else {
                std::string cmd_str_search;
                token *T = t_cmd;
                while (T != NULL && T->length > 0) {
                    LC_LOG_VERBOSE("search token [%p/%s@%zu+%zu]",T,T->value.c_str(),T->offset,T->length);
                    if (!cmd_str_search.empty())
                        cmd_str_search += ' ';
                    cmd_str_search.append(T->value);
                    if (T->next == NULL && insert_idx > (T->offset + T->length))
                        cmd_str_search += ' ';
                    T = T->next;
                }
                // build match list
                typedef std::list<command*> command_list_t;
                command_list_t match;
                unsigned int match_max_length = 0;
                command_sorted_list_t::const_iterator ci = C_sorted.begin();
                while (ci != C_sorted.end()) {
                    command *cmd = *ci++;
                    if ((cmd->mask & mask) != 0 && !cmd->hidden && (cmd_str_search.empty() || cmd->cmd_str.compare(0,cmd_str_search.length(),cmd_str_search) == 0)) {
                        match.push_back(cmd);
                        if (cmd->cmd_str.length() > match_max_length)
                            match_max_length = cmd->cmd_str.length();
                    }
                }
                // dump match list
                command_list_t::const_iterator mi = match.begin();
                while (mi != match.end()) {
                    const command *cmd = *mi++;
                    printf("%-*s : %s\n", match_max_length, cmd->cmd_str.c_str(), cmd->help.c_str());
                }
            }
            break;
        }

        rewind();
    }